

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QList<QPointer<QWidget>_> * __thiscall
QMenuPrivate::calcCausedStack(QList<QPointer<QWidget>_> *__return_storage_ptr__,QMenuPrivate *this)

{
  Data *pDVar1;
  QTornOffMenu *pQVar2;
  QMenu *pQVar3;
  QWidget *p;
  long in_FS_OFFSET;
  QWeakPointer<QObject> QStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPointer<QWidget> *)0x0;
  pDVar1 = (this->causedPopup).widget.wp.d;
  if ((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) goto LAB_0041f10d;
  p = (QWidget *)0x0;
  while (p != (QWidget *)0x0) {
    QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&QStack_38,p);
    QList<QPointer<QWidget>>::emplaceBack<QPointer<QWidget>>
              ((QList<QPointer<QWidget>> *)__return_storage_ptr__,(QPointer<QWidget> *)&QStack_38);
    QWeakPointer<QObject>::~QWeakPointer(&QStack_38);
    pQVar2 = QtPrivate::qobject_cast_helper<QTornOffMenu*,QObject>(&p->super_QObject);
    if (pQVar2 != (QTornOffMenu *)0x0) {
      QList<QPointer<QWidget>_>::append
                (__return_storage_ptr__,
                 (QList<QPointer<QWidget>_> *)
                 (*(long *)&(pQVar2->super_QMenu).super_QWidget.field_0x8 + 0x438));
    }
    pQVar3 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(&p->super_QObject);
    if (pQVar3 == (QMenu *)0x0) break;
    this = *(QMenuPrivate **)&(pQVar3->super_QWidget).field_0x8;
    pDVar1 = (this->causedPopup).widget.wp.d;
    p = (QWidget *)0x0;
    if ((pDVar1 != (Data *)0x0) && (p = (QWidget *)0x0, *(int *)(pDVar1 + 4) != 0)) {
LAB_0041f10d:
      p = (QWidget *)(this->causedPopup).widget.wp.value;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QPointer<QWidget>> QMenuPrivate::calcCausedStack() const
{
    QList<QPointer<QWidget>> ret;
    for(QWidget *widget = causedPopup.widget; widget; ) {
        ret.append(widget);
        if (QTornOffMenu *qtmenu = qobject_cast<QTornOffMenu*>(widget))
            ret += qtmenu->d_func()->causedStack;
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget))
            widget = qmenu->d_func()->causedPopup.widget;
        else
            break;
    }
    return ret;
}